

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::rewrite_load_for_wrapped_row_major
          (CompilerGLSL *this,string *expr,TypeID loaded_type,ID ptr)

{
  byte bVar1;
  bool bVar2;
  SPIRVariable *pSVar3;
  SPIRType *type;
  SPIRType *type_00;
  char (*in_R8) [2];
  uint32_t i;
  uint index;
  Bitset local_70;
  
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr.id);
  if ((((pSVar3 != (SPIRVariable *)0x0) &&
       (type = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc),
       *(int *)&(type->super_IVariant).field_0xc == 0xf)) && (type->storage == StorageClassUniform))
     && (bVar2 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock
                           ), bVar2)) {
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,loaded_type.id);
    bVar2 = Compiler::is_matrix(&this->super_Compiler,type_00);
    if (!bVar2) {
      type = type_00;
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      index = 0;
      do {
        if ((uint)(type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size <=
            index) {
          return;
        }
        Compiler::combined_decoration_for_member(&local_70,&this->super_Compiler,type,index);
        bVar1 = (byte)local_70.lower;
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_70.higher._M_h);
        index = index + 1;
      } while ((bVar1 & 0x10) == 0);
      request_workaround_wrapper_overload(this,loaded_type);
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[2]>
                ((string *)&local_70,(spirv_cross *)0x37b362,(char (*) [23])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,in_R8
                );
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::rewrite_load_for_wrapped_row_major(std::string &expr, TypeID loaded_type, ID ptr)
{
	// Loading row-major matrices from UBOs on older AMD Windows OpenGL drivers is problematic.
	// To load these types correctly, we must first wrap them in a dummy function which only purpose is to
	// ensure row_major decoration is actually respected.
	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	bool is_ubo = backing_type.basetype == SPIRType::Struct && backing_type.storage == StorageClassUniform &&
	              has_decoration(backing_type.self, DecorationBlock);
	if (!is_ubo)
		return;

	auto *type = &get<SPIRType>(loaded_type);
	bool rewrite = false;

	if (is_matrix(*type))
	{
		// To avoid adding a lot of unnecessary meta tracking to forward the row_major state,
		// we will simply look at the base struct itself. It is exceptionally rare to mix and match row-major/col-major state.
		// If there is any row-major action going on, we apply the workaround.
		// It is harmless to apply the workaround to column-major matrices, so this is still a valid solution.
		// If an access chain occurred, the workaround is not required, so loading vectors or scalars don't need workaround.
		type = &backing_type;
	}

	if (type->basetype == SPIRType::Struct)
	{
		// If we're loading a struct where any member is a row-major matrix, apply the workaround.
		for (uint32_t i = 0; i < uint32_t(type->member_types.size()); i++)
		{
			if (combined_decoration_for_member(*type, i).get(DecorationRowMajor))
			{
				rewrite = true;
				break;
			}
		}
	}

	if (rewrite)
	{
		request_workaround_wrapper_overload(loaded_type);
		expr = join("spvWorkaroundRowMajor(", expr, ")");
	}
}